

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createDeviceFeatures2Test
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *vkp;
  void *pvVar1;
  undefined8 instance;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 device;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  VkResult result;
  VkPhysicalDevice physicalDevice;
  VkQueue queue;
  NotSupportedError *this;
  long *plVar7;
  size_type *psVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledExts;
  float queuePriority;
  size_type __dnew;
  InstanceDriver vki;
  VkPhysicalDeviceFeatures2KHR enabledFeatures;
  DeviceDriver vkd;
  undefined1 local_7e8 [24];
  VkDeviceQueueCreateInfo *local_7d0;
  deUint32 local_7c8;
  char **local_7c0;
  deUint32 local_7b8;
  char **local_7b0;
  VkPhysicalDeviceFeatures *pVStack_7a8;
  Maybe<unsigned_int> local_7a0;
  VkAllocationCallbacks *local_790;
  void *local_788;
  undefined8 uStack_780;
  deUint32 local_778;
  Maybe<unsigned_int> *local_770;
  undefined1 local_768 [400];
  undefined1 local_5d8 [240];
  undefined1 local_4e8 [1208];
  
  vkp = context->m_platformInterface;
  ::vk::enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             local_5d8,vkp,(char *)0x0);
  local_7e8._0_8_ = (pointer)0x0;
  local_7e8._8_8_ = (pointer)0x0;
  local_7e8._16_8_ = (pointer)0x0;
  local_768._0_8_ = local_768 + 0x10;
  local_790 = (VkAllocationCallbacks *)&DAT_00000026;
  local_768._0_8_ = std::__cxx11::string::_M_create((ulong *)local_768,(ulong)&local_790);
  local_768._16_8_ = local_790;
  builtin_strncpy((char *)local_768._0_8_,"VK_KHR_get_physical_device_properties2",0x26);
  local_768._8_8_ = local_790;
  *(char *)(local_768._0_8_ + (long)local_790) = '\0';
  local_790 = (VkAllocationCallbacks *)0x0;
  local_7a0.m_ptr = (uint *)0x0;
  ::vk::RequiredExtension::RequiredExtension
            ((RequiredExtension *)local_4e8,(string *)local_768,(Maybe<unsigned_int> *)&local_790,
             &local_7a0);
  bVar6 = ::vk::isExtensionSupported
                    ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                      *)local_5d8,(RequiredExtension *)local_4e8);
  if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
    operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
  }
  if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
    operator_delete((void *)local_768._0_8_,(ulong)(local_768._16_8_ + 1));
  }
  if (bVar6) {
    local_4e8._0_8_ = local_4e8 + 0x10;
    local_768._0_8_ = &DAT_00000026;
    local_4e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_4e8,(ulong)local_768);
    local_4e8._16_8_ = local_768._0_8_;
    builtin_strncpy((char *)local_4e8._0_8_,"VK_KHR_get_physical_device_properties2",0x26);
    local_4e8._8_8_ = local_768._0_8_;
    *(char *)(local_4e8._0_8_ + local_768._0_8_) = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_7e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8);
    if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
      operator_delete((void *)local_4e8._0_8_,(ulong)(local_4e8._16_8_ + 1));
    }
    local_4e8._0_8_ = (VkDevice)0x0;
    local_4e8._8_8_ = (pointer)0x0;
    local_4e8._16_8_ = 0;
    ::vk::createDefaultInstance
              ((Move<vk::VkInstance_s_*> *)local_768,vkp,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_7e8,(VkAllocationCallbacks *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_7e8);
    pvVar1 = (void *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,local_5d8._16_8_ - (long)pvVar1);
    }
    uVar3 = local_768._16_8_;
    uVar2 = local_768._8_8_;
    instance = local_768._0_8_;
    ::vk::InstanceDriver::InstanceDriver
              ((InstanceDriver *)local_768,vkp,(VkInstance)local_768._0_8_);
    physicalDevice =
         ::vk::chooseDevice((InstanceInterface *)local_768,(VkInstance)instance,
                            context->m_testCtx->m_cmdLine);
    local_7a0.m_ptr = (uint *)CONCAT44(local_7a0.m_ptr._4_4_,0x3f800000);
    local_790 = (VkAllocationCallbacks *)CONCAT44(local_790._4_4_,2);
    local_788 = (void *)0x0;
    uStack_780 = 0;
    local_778 = 1;
    local_770 = &local_7a0;
    local_7e8._0_4_ = 3;
    local_7e8._8_8_ = local_5d8;
    local_7e8._16_8_ = (pointer)0x100000000;
    local_7c8 = 0;
    local_7c0 = (char **)0x0;
    local_7b8 = 0;
    local_7b0 = (char **)0x0;
    pVStack_7a8 = (VkPhysicalDeviceFeatures *)0x0;
    local_5d8._0_4_ = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
    local_5d8._8_8_ = (pointer)0x0;
    local_7d0 = (VkDeviceQueueCreateInfo *)&local_790;
    ::vk::InstanceDriver::getPhysicalDeviceFeatures2KHR
              ((InstanceDriver *)local_768,physicalDevice,
               (VkPhysicalDeviceFeatures2KHR *)local_7e8._8_8_);
    ::vk::createDevice((Move<vk::VkDevice_s_*> *)local_4e8,(InstanceInterface *)local_768,
                       physicalDevice,(VkDeviceCreateInfo *)local_7e8,(VkAllocationCallbacks *)0x0);
    uVar5 = local_4e8._16_8_;
    uVar4 = local_4e8._8_8_;
    device = local_4e8._0_8_;
    ::vk::DeviceDriver::DeviceDriver
              ((DeviceDriver *)local_4e8,(InstanceInterface *)local_768,(VkDevice)local_4e8._0_8_);
    queue = ::vk::getDeviceQueue((DeviceInterface *)local_4e8,(VkDevice)device,0,0);
    result = ::vk::DeviceDriver::queueWaitIdle((DeviceDriver *)local_4e8,queue);
    ::vk::checkResult(result,"vkd.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                      ,0x2b1);
    ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)local_4e8);
    if ((VkDevice)device != (VkDevice)0x0) {
      (*(code *)uVar4)(device,uVar5);
    }
    local_4e8._0_8_ = local_4e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_4e8._0_8_,
               (pointer)(local_4e8._0_8_ + (long)(_Alloc_hider *)local_4e8._8_8_));
    if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
      operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
    }
    ::vk::InstanceDriver::~InstanceDriver((InstanceDriver *)local_768);
    if ((VkInstance)instance != (VkInstance)0x0) {
      (*(code *)uVar2)((VkInstance)instance,(VkAllocationCallbacks *)uVar3);
    }
    return __return_storage_ptr__;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_768._0_8_ = local_768 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_768,"VK_KHR_get_physical_device_properties2","");
  plVar7 = (long *)std::__cxx11::string::append(local_768);
  local_4e8._0_8_ = *plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_4e8._0_8_ == psVar8) {
    local_4e8._16_8_ = *psVar8;
    local_4e8._24_8_ = plVar7[3];
    local_4e8._0_8_ = local_4e8 + 0x10;
  }
  else {
    local_4e8._16_8_ = *psVar8;
  }
  local_4e8._8_8_ = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError
            (this,(char *)local_4e8._0_8_,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
             ,0x27c);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus createDeviceFeatures2Test (Context& context)
{
	const PlatformInterface&		vkp						= context.getPlatformInterface();
	const Unique<VkInstance>		instance				(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki						(vkp, instance.get());
	const VkPhysicalDevice			physicalDevice			= chooseDevice(vki, instance.get(), context.getTestContext().getCommandLine());
	const deUint32					queueFamilyIndex		= 0;
	const deUint32					queueCount				= 1;
	const deUint32					queueIndex				= 0;
	const float						queuePriority			= 1.0f;

	VkPhysicalDeviceFeatures2KHR	enabledFeatures;
	const VkDeviceQueueCreateInfo	deviceQueueCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
		DE_NULL,
		(VkDeviceQueueCreateFlags)0u,
		queueFamilyIndex,
		queueCount,
		&queuePriority,
	};
	const VkDeviceCreateInfo		deviceCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,
		&enabledFeatures,
		(VkDeviceCreateFlags)0u,
		1,
		&deviceQueueCreateInfo,
		0,
		DE_NULL,
		0,
		DE_NULL,
		DE_NULL,
	};

	// Populate enabledFeatures
	enabledFeatures.sType		= VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
	enabledFeatures.pNext		= DE_NULL;

	vki.getPhysicalDeviceFeatures2KHR(physicalDevice, &enabledFeatures);

	{
		const Unique<VkDevice>	device		(createDevice(vki, physicalDevice, &deviceCreateInfo));
		const DeviceDriver		vkd			(vki, device.get());
		const VkQueue			queue		= getDeviceQueue(vkd, *device, queueFamilyIndex, queueIndex);

		VK_CHECK(vkd.queueWaitIdle(queue));
	}

	return tcu::TestStatus::pass("Pass");
}